

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_AddXssSafeModifier::Run(void)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = ctemplate::AddXssSafeModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
  if (cVar1 == '\0') {
    pcVar2 = "ctemplate::AddXssSafeModifier(\"x-asafetest\", esc_fn)";
  }
  else {
    cVar1 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') {
      pcVar2 = "ctemplate::AddXssSafeModifier(\"x-asafetest-arg=\", esc_fn)";
    }
    else {
      cVar1 = ctemplate::AddXssSafeModifier
                        ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
      if (cVar1 == '\0') {
        pcVar2 = "ctemplate::AddXssSafeModifier(\"x-asafetest-arg=h\", esc_fn)";
      }
      else {
        cVar1 = ctemplate::AddXssSafeModifier("test",(TemplateModifier *)&ctemplate::html_escape);
        if (cVar1 == '\0') {
          cVar1 = ctemplate::AddXssSafeModifier
                            ("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
          if (cVar1 == '\0') {
            cVar1 = ctemplate::AddXssSafeModifier
                              ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
            if (cVar1 == '\0') {
              cVar1 = ctemplate::AddXssSafeModifier
                                ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
              if (cVar1 == '\0') {
                cVar1 = ctemplate::AddModifier
                                  ("x-safetest2",(TemplateModifier *)&ctemplate::html_escape);
                if (cVar1 == '\0') {
                  pcVar2 = "ctemplate::AddModifier(\"x-safetest2\", esc_fn)";
                }
                else {
                  cVar1 = ctemplate::AddModifier
                                    ("x-safetest2-arg=",(TemplateModifier *)&ctemplate::html_escape)
                  ;
                  if (cVar1 == '\0') {
                    pcVar2 = "ctemplate::AddModifier(\"x-safetest2-arg=\", esc_fn)";
                  }
                  else {
                    cVar1 = ctemplate::AddModifier
                                      ("x-safetest2-arg=h",
                                       (TemplateModifier *)&ctemplate::html_escape);
                    if (cVar1 == '\0') {
                      pcVar2 = "ctemplate::AddModifier(\"x-safetest2-arg=h\", esc_fn)";
                    }
                    else {
                      cVar1 = ctemplate::AddXssSafeModifier
                                        ("x-safetest2",(TemplateModifier *)&ctemplate::html_escape);
                      if (cVar1 == '\0') {
                        cVar1 = ctemplate::AddXssSafeModifier
                                          ("x-safetest2-arg=",
                                           (TemplateModifier *)&ctemplate::html_escape);
                        if (cVar1 == '\0') {
                          cVar1 = ctemplate::AddXssSafeModifier
                                            ("x-safetest2-arg=h",
                                             (TemplateModifier *)&ctemplate::html_escape);
                          if (cVar1 == '\0') {
                            cVar1 = ctemplate::AddModifier
                                              ("x-asafetest",
                                               (TemplateModifier *)&ctemplate::html_escape);
                            if (cVar1 == '\0') {
                              cVar1 = ctemplate::AddModifier
                                                ("x-asafetest-arg=",
                                                 (TemplateModifier *)&ctemplate::html_escape);
                              if (cVar1 == '\0') {
                                cVar1 = ctemplate::AddModifier
                                                  ("x-asafetest-arg=h",
                                                   (TemplateModifier *)&ctemplate::html_escape);
                                if (cVar1 == '\0') {
                                  return;
                                }
                                pcVar2 = "!(ctemplate::AddModifier(\"x-asafetest-arg=h\", esc_fn))";
                              }
                              else {
                                pcVar2 = "!(ctemplate::AddModifier(\"x-asafetest-arg=\", esc_fn))";
                              }
                            }
                            else {
                              pcVar2 = "!(ctemplate::AddModifier(\"x-asafetest\", esc_fn))";
                            }
                          }
                          else {
                            pcVar2 = 
                            "!(ctemplate::AddXssSafeModifier(\"x-safetest2-arg=h\", esc_fn))";
                          }
                        }
                        else {
                          pcVar2 = "!(ctemplate::AddXssSafeModifier(\"x-safetest2-arg=\", esc_fn))";
                        }
                      }
                      else {
                        pcVar2 = "!(ctemplate::AddXssSafeModifier(\"x-safetest2\", esc_fn))";
                      }
                    }
                  }
                }
              }
              else {
                pcVar2 = "!(ctemplate::AddXssSafeModifier(\"x-asafetest-arg=h\", esc_fn))";
              }
            }
            else {
              pcVar2 = "!(ctemplate::AddXssSafeModifier(\"x-asafetest-arg=\", esc_fn))";
            }
          }
          else {
            pcVar2 = "!(ctemplate::AddXssSafeModifier(\"x-asafetest\", esc_fn))";
          }
        }
        else {
          pcVar2 = "!(ctemplate::AddXssSafeModifier(\"test\", esc_fn))";
        }
      }
    }
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar2);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, AddXssSafeModifier) {
  // For shorter lines.
  const GOOGLE_NAMESPACE::TemplateModifier* esc_fn =
      &GOOGLE_NAMESPACE::html_escape;

  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h", esc_fn));

  // Make sure AddXssSafeModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("test", esc_fn));

  // Make sure AddXssSafeModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h",
                                             esc_fn));

  // Make sure AddXssSafeModifier fails if the same modifier was
  // previously added via AddModifier.
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=h", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=h", esc_fn));

  // and vice versa.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=h", esc_fn));
}